

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_declared_member_location
          (CompilerGLSL *this,SPIRVariable *var,uint32_t mbr_idx,bool strip_array)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_member_decoration
                    (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,mbr_idx,
                     DecorationLocation);
  if (bVar1) {
    uVar2 = Compiler::get_member_decoration
                      (&this->super_Compiler,(TypeID)(pSVar3->super_IVariant).self.id,mbr_idx,
                       DecorationLocation);
    return uVar2;
  }
  uVar2 = get_accumulated_member_location(this,var,mbr_idx,strip_array);
  return uVar2;
}

Assistant:

uint32_t CompilerGLSL::get_declared_member_location(const SPIRVariable &var, uint32_t mbr_idx, bool strip_array) const
{
	auto &block_type = get<SPIRType>(var.basetype);
	if (has_member_decoration(block_type.self, mbr_idx, DecorationLocation))
		return get_member_decoration(block_type.self, mbr_idx, DecorationLocation);
	else
		return get_accumulated_member_location(var, mbr_idx, strip_array);
}